

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imstb_truetype.h
# Opt level: O0

void stbtt__dict_get_ints(stbtt__buf *b,int key,int outcount,stbtt_uint32 *out)

{
  stbtt_uint32 sVar1;
  long in_RCX;
  int in_EDX;
  stbtt__buf sVar2;
  stbtt__buf operands;
  int i;
  int in_stack_ffffffffffffffcc;
  stbtt__buf *in_stack_ffffffffffffffd0;
  int local_1c;
  
  sVar2 = stbtt__dict_get(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffcc);
  for (local_1c = 0; local_1c < in_EDX && sVar2.cursor < sVar2.size; local_1c = local_1c + 1) {
    sVar1 = stbtt__cff_int(sVar2._8_8_);
    *(stbtt_uint32 *)(in_RCX + (long)local_1c * 4) = sVar1;
  }
  return;
}

Assistant:

static void stbtt__dict_get_ints(stbtt__buf *b, int key, int outcount, stbtt_uint32 *out)
{
   int i;
   stbtt__buf operands = stbtt__dict_get(b, key);
   for (i = 0; i < outcount && operands.cursor < operands.size; i++)
      out[i] = stbtt__cff_int(&operands);
}